

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

uint64_t PopulationCost(uint32_t *population,int length,uint16_t *trivial_sym,uint8_t *is_used)

{
  uint16_t uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LBitEntropy local_40;
  VP8LStreaks local_28;
  
  (*VP8LGetEntropyUnrefined)(population,length,&local_40,&local_28);
  if (trivial_sym != (uint16_t *)0x0) {
    uVar1 = 0xffff;
    if (local_40.nonzeros == 1) {
      uVar1 = (uint16_t)local_40.nonzero_code;
    }
    *trivial_sym = uVar1;
  }
  if (is_used != (uint8_t *)0x0) {
    *is_used = local_28.streaks[1][1] != 0 || local_28.streaks[1][0] != 0;
  }
  lVar2 = 0x273;
  if (local_40.nonzeros < 5) {
    if (local_40.nonzeros < 2) {
      uVar5 = 0;
      goto LAB_00176422;
    }
    if (local_40.nonzeros == 3) {
      lVar2 = 0x3b6;
    }
    else {
      if (local_40.nonzeros == 2) {
        lVar3 = (ulong)local_40.sum * 0x31800000;
        lVar2 = lVar3 + local_40.entropy + 0x32;
        if ((long)(lVar3 + local_40.entropy) < 0) {
          lVar2 = lVar3 + local_40.entropy + -0x32;
        }
        uVar5 = lVar2 / 100;
        goto LAB_00176422;
      }
      lVar2 = 700;
    }
  }
  lVar3 = (ulong)(local_40.sum * 2 - local_40.max_val) * lVar2 * 0x800000;
  lVar4 = (1000 - lVar2) * local_40.entropy;
  lVar2 = lVar3 + lVar4 + 500;
  if (lVar3 + lVar4 < 0) {
    lVar2 = lVar3 + lVar4 + -500;
  }
  uVar5 = lVar2 / 1000;
  if ((ulong)(lVar2 / 1000) < local_40.entropy) {
    uVar5 = local_40.entropy;
  }
LAB_00176422:
  return uVar5 + (ulong)(uint)(local_28.streaks[1][0] * 0xd20 + local_28.streaks[0][0] * 0x730 +
                              local_28.streaks[1][1] * 0x2d0 + local_28.counts[1] * 0xa50 +
                              local_28.streaks[0][1] * 0xf0 + local_28.counts[0] * 0x640) * 0x2000 +
         0x17f33333;
}

Assistant:

static uint64_t PopulationCost(const uint32_t* const population, int length,
                               uint16_t* const trivial_sym,
                               uint8_t* const is_used) {
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LGetEntropyUnrefined(population, length, &bit_entropy, &stats);
  if (trivial_sym != NULL) {
    *trivial_sym = (bit_entropy.nonzeros == 1) ? bit_entropy.nonzero_code
                                               : VP8L_NON_TRIVIAL_SYM;
  }
  if (is_used != NULL) {
    // The histogram is used if there is at least one non-zero streak.
    *is_used = (stats.streaks[1][0] != 0 || stats.streaks[1][1] != 0);
  }

  return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
}